

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr finish_parse_body(parser *p)

{
  ushort uVar1;
  equip_slot *peVar2;
  object *poVar3;
  undefined6 uVar4;
  angband_constants *paVar5;
  player_body *ppVar6;
  equip_slot *peVar7;
  equip_slot *peVar8;
  equip_slot *peVar9;
  uint16_t uVar10;
  ulong uVar11;
  player_body *ppVar12;
  
  ppVar6 = (player_body *)parser_priv(p);
  paVar5 = z_info;
  bodies = ppVar6;
  z_info->equip_slots_max = 0;
  ppVar12 = bodies;
  if (ppVar6 != (player_body *)0x0) {
    uVar10 = paVar5->equip_slots_max;
    do {
      uVar1 = ppVar6->count;
      if (uVar10 < uVar1) {
        paVar5->equip_slots_max = uVar1;
        uVar10 = uVar1;
      }
      ppVar6 = ppVar6->next;
      ppVar12 = bodies;
    } while (ppVar6 != (player_body *)0x0);
  }
  do {
    if (ppVar12 == (player_body *)0x0) {
      parser_destroy(p);
      return 0;
    }
    peVar7 = (equip_slot *)mem_zalloc((ulong)z_info->equip_slots_max << 5);
    paVar5 = z_info;
    peVar8 = ppVar12->slots;
    if (peVar8 != (equip_slot *)0x0) {
      if (z_info->equip_slots_max != 0) {
        uVar11 = 0;
        peVar9 = peVar7;
        do {
          peVar2 = peVar8->next;
          uVar10 = peVar8->type;
          uVar4 = *(undefined6 *)&peVar8->field_0xa;
          poVar3 = peVar8->obj;
          peVar9->name = peVar8->name;
          peVar9->obj = poVar3;
          peVar9->next = peVar2;
          peVar9->type = uVar10;
          *(undefined6 *)&peVar9->field_0xa = uVar4;
          peVar8 = peVar8->next;
          if (peVar8 == (equip_slot *)0x0) break;
          uVar11 = uVar11 + 1;
          peVar9 = peVar9 + 1;
        } while (uVar11 < paVar5->equip_slots_max);
      }
      if (z_info->equip_slots_max != 0) {
        uVar11 = 0;
        peVar8 = peVar7;
        do {
          if (peVar8->next != (equip_slot *)0x0) {
            peVar8->next = peVar8 + 1;
          }
          uVar11 = uVar11 + 1;
          peVar8 = peVar8 + 1;
        } while (uVar11 < z_info->equip_slots_max);
      }
      peVar8 = ppVar12->slots;
      while (peVar8 != (equip_slot *)0x0) {
        peVar9 = peVar8->next;
        mem_free(peVar8);
        peVar8 = peVar9;
      }
    }
    ppVar12->slots = peVar7;
    ppVar12 = ppVar12->next;
  } while( true );
}

Assistant:

static errr finish_parse_body(struct parser *p) {
	struct player_body *b;
	int i;
	bodies = parser_priv(p);

	/* Scan the list for the max slots */
	z_info->equip_slots_max = 0;
	for (b = bodies; b; b = b->next) {
		if (b->count > z_info->equip_slots_max)
			z_info->equip_slots_max = b->count;
	}

	/* Allocate the slot list and copy */
	for (b = bodies; b; b = b->next) {
		struct equip_slot *s_new;

		s_new = mem_zalloc(z_info->equip_slots_max * sizeof(*s_new));
		if (b->slots) {
			struct equip_slot *s_temp, *s_old = b->slots;

			/* Allocate space and copy */
			for (i = 0; i < z_info->equip_slots_max; i++) {
				memcpy(&s_new[i], s_old, sizeof(*s_old));
				s_old = s_old->next;
				if (!s_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->equip_slots_max; i++)
				if (s_new[i].next)
					s_new[i].next = &s_new[i + 1];

			/* Tidy up */
			s_old = b->slots;
			s_temp = s_old;
			while (s_temp) {
				s_temp = s_old->next;
				mem_free(s_old);
				s_old = s_temp;
			}
		}
		b->slots = s_new;
	}
	parser_destroy(p);
	return 0;
}